

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O0

void anon_unknown.dwarf_f7fbf::readWholeFiles(int modification)

{
  float fVar1;
  LineOrder LVar2;
  Compression CVar3;
  ulong uVar4;
  bool bVar5;
  __type _Var6;
  int iVar7;
  int iVar8;
  char *fileName;
  float *pfVar9;
  V2f *this;
  V2f *v;
  LineOrder *pLVar10;
  Compression *pCVar11;
  Array2D<half> *hData_00;
  size_type sVar12;
  reference pvVar13;
  reference __b;
  uint *puVar14;
  int in_EDI;
  int numYTiles_1;
  int numXTiles_1;
  DeepFrameBuffer frameBuffer_3;
  int h_1;
  int w_1;
  int yLevel_1;
  int xLevel_1;
  int numYLevels_1;
  int numXLevels_1;
  DeepTiledInputPart part_3;
  DeepFrameBuffer frameBuffer_2;
  DeepScanLineInputPart part_2;
  int numYTiles;
  int numXTiles;
  FrameBuffer frameBuffer_1;
  int h;
  int w;
  int yLevel;
  int xLevel;
  int numYLevels;
  int numXLevels;
  TiledInputPart part_1;
  InputPart part;
  FrameBuffer frameBuffer;
  size_t i_3;
  int partNumber;
  size_t b;
  size_t a;
  size_t i_2;
  int i_1;
  vector<int,_std::allocator<int>_> shuffledPartNumber;
  Header *header;
  int i;
  MultiPartInputFile file;
  Array2D<unsigned_int> sampleCount;
  Array2D<half_*> deepHData;
  Array2D<float_*> deepFData;
  Array2D<unsigned_int_*> deepUData;
  Array2D<half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  int in_stack_fffffffffffffad8;
  int in_stack_fffffffffffffadc;
  int in_stack_fffffffffffffae0;
  int in_stack_fffffffffffffae4;
  int in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaec;
  DeepFrameBuffer *in_stack_fffffffffffffaf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaf8;
  int in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb04;
  undefined1 in_stack_fffffffffffffb05;
  undefined1 in_stack_fffffffffffffb06;
  undefined1 in_stack_fffffffffffffb07;
  Array2D<unsigned_int> *in_stack_fffffffffffffb08;
  int in_stack_fffffffffffffb14;
  int in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  PixelType t;
  uint width;
  string *in_stack_fffffffffffffbc8;
  string *in_stack_fffffffffffffbd0;
  string *in_stack_fffffffffffffbd8;
  DeepFrameBuffer *in_stack_fffffffffffffbe0;
  string *in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffcc0;
  undefined1 reconstructChunkOffsetTable;
  int in_stack_fffffffffffffcc4;
  undefined4 in_stack_fffffffffffffcd0;
  Slice local_320 [2];
  int local_280;
  int local_27c;
  int local_278;
  int local_274;
  int local_270;
  int local_26c;
  Slice local_260 [3];
  int local_1b8;
  int local_1b4;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  ulong local_128;
  int local_11c;
  size_type local_118;
  size_type local_110;
  ulong local_108;
  uint local_fc;
  vector<int,_std::allocator<int>_> local_f8;
  Header *local_e0;
  int local_d4;
  Array2D<unsigned_int> local_c0;
  Array2D<half_*> local_a8;
  Array2D<float_*> local_90;
  Array2D<unsigned_int_*> local_78;
  Array2D<half> local_60;
  Array2D<float> local_38;
  Array2D<unsigned_int> local_20;
  int local_4;
  
  reconstructChunkOffsetTable = (undefined1)((uint)in_stack_fffffffffffffcc0 >> 0x18);
  local_4 = in_EDI;
  Imf_2_5::Array2D<unsigned_int>::Array2D(&local_20);
  Imf_2_5::Array2D<float>::Array2D(&local_38);
  Imf_2_5::Array2D<half>::Array2D(&local_60);
  Imf_2_5::Array2D<unsigned_int_*>::Array2D(&local_78);
  Imf_2_5::Array2D<float_*>::Array2D(&local_90);
  Imf_2_5::Array2D<half_*>::Array2D(&local_a8);
  Imf_2_5::Array2D<unsigned_int>::Array2D(&local_c0);
  fileName = (char *)std::__cxx11::string::c_str();
  iVar7 = Imf_2_5::globalThreadCount();
  Imf_2_5::MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)CONCAT44(iVar7,in_stack_fffffffffffffcd0),fileName,
             in_stack_fffffffffffffcc4,(bool)reconstructChunkOffsetTable);
  local_d4 = 0;
  while( true ) {
    iVar7 = local_d4;
    iVar8 = Imf_2_5::MultiPartInputFile::parts((MultiPartInputFile *)0x1a97d0);
    if (iVar8 <= iVar7) {
      hData_00 = (Array2D<half> *)std::operator<<((ostream *)&std::cout,"Reading whole files ");
      std::ostream::operator<<(hData_00,std::flush<char,std::char_traits<char>>);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a9f05);
      local_fc = (uint)(0 < local_4);
      while (width = local_fc,
            sVar12 = std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::size
                               ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                                (anonymous_namespace)::headers), (int)width < (int)sVar12) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffaf0,
                   (value_type_conflict3 *)
                   CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
        local_fc = local_fc + 1;
      }
      for (local_108 = 0; uVar4 = local_108,
          sVar12 = std::vector<int,_std::allocator<int>_>::size(&local_f8), uVar4 < sVar12;
          local_108 = local_108 + 1) {
        std::vector<int,_std::allocator<int>_>::size(&local_f8);
        iVar7 = random_int(in_stack_fffffffffffffae4);
        local_110 = (size_type)iVar7;
        std::vector<int,_std::allocator<int>_>::size(&local_f8);
        iVar7 = random_int(in_stack_fffffffffffffae4);
        local_118 = (size_type)iVar7;
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&local_f8,local_110);
        __b = std::vector<int,_std::allocator<int>_>::operator[](&local_f8,local_118);
        std::swap<int>(pvVar13,__b);
      }
      local_128 = 0;
      do {
        uVar4 = local_128;
        sVar12 = std::vector<int,_std::allocator<int>_>::size(&local_f8);
        if (sVar12 <= uVar4) {
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffaf0);
          Imf_2_5::MultiPartInputFile::~MultiPartInputFile
                    ((MultiPartInputFile *)
                     CONCAT17(in_stack_fffffffffffffb07,
                              CONCAT16(in_stack_fffffffffffffb06,
                                       CONCAT15(in_stack_fffffffffffffb05,
                                                CONCAT14(in_stack_fffffffffffffb04,
                                                         in_stack_fffffffffffffb00)))));
          Imf_2_5::Array2D<unsigned_int>::~Array2D
                    ((Array2D<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
          Imf_2_5::Array2D<half_*>::~Array2D
                    ((Array2D<half_*> *)
                     CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
          Imf_2_5::Array2D<float_*>::~Array2D
                    ((Array2D<float_*> *)
                     CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
          Imf_2_5::Array2D<unsigned_int_*>::~Array2D
                    ((Array2D<unsigned_int_*> *)
                     CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
          Imf_2_5::Array2D<half>::~Array2D
                    ((Array2D<half> *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0))
          ;
          Imf_2_5::Array2D<float>::~Array2D
                    ((Array2D<float> *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                    );
          Imf_2_5::Array2D<unsigned_int>::~Array2D
                    ((Array2D<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
          return;
        }
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&local_f8,local_128);
        local_11c = *pvVar13;
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::partTypes,
                             (long)local_11c);
        switch(*pvVar13) {
        case 0:
          Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x1aa131);
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                     (long)local_11c);
          in_stack_fffffffffffffad8 = 0x10;
          setInputFrameBuffer((FrameBuffer *)in_stack_fffffffffffffbe0,
                              (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                              (Array2D<unsigned_int> *)in_stack_fffffffffffffbd0,
                              (Array2D<float> *)in_stack_fffffffffffffbc8,hData_00,width,
                              (int)in_stack_fffffffffffffbf0);
          Imf_2_5::InputPart::InputPart
                    ((InputPart *)in_stack_fffffffffffffaf0,
                     (MultiPartInputFile *)
                     CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                     in_stack_fffffffffffffae4);
          Imf_2_5::InputPart::setFrameBuffer
                    ((InputPart *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                     (FrameBuffer *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
          Imf_2_5::InputPart::readPixels
                    ((InputPart *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                     in_stack_fffffffffffffadc,in_stack_fffffffffffffad8);
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (anonymous_namespace)::pixelTypes,(long)local_11c);
          iVar7 = *pvVar13;
          if (iVar7 == 0) {
            bVar5 = checkPixels<unsigned_int>
                              ((Array2D<unsigned_int> *)
                               CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                               in_stack_fffffffffffffadc,in_stack_fffffffffffffad8);
            if (!bVar5) {
              __assert_fail("checkPixels<unsigned int>(uData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                            ,0x32c,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if (iVar7 == 1) {
            bVar5 = checkPixels<float>((Array2D<float> *)
                                       CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                       ,in_stack_fffffffffffffadc,in_stack_fffffffffffffad8);
            if (!bVar5) {
              __assert_fail("checkPixels<float>(fData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                            ,0x32f,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if ((iVar7 == 2) &&
                  (bVar5 = checkPixels<half>((Array2D<half> *)
                                             CONCAT44(in_stack_fffffffffffffae4,
                                                      in_stack_fffffffffffffae0),
                                             in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                  !bVar5)) {
            __assert_fail("checkPixels<half>(hData, width, height)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                          ,0x332,"void (anonymous namespace)::readWholeFiles(int)");
          }
          Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1aa32f);
          break;
        case 1:
          Imf_2_5::TiledInputPart::TiledInputPart
                    ((TiledInputPart *)in_stack_fffffffffffffaf0,
                     (MultiPartInputFile *)
                     CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                     in_stack_fffffffffffffae4);
          local_16c = Imf_2_5::TiledInputPart::numXLevels((TiledInputPart *)0x1aa35f);
          local_170 = Imf_2_5::TiledInputPart::numYLevels((TiledInputPart *)0x1aa383);
          for (local_174 = 0; local_174 < local_16c; local_174 = local_174 + 1) {
            for (local_178 = 0; local_178 < local_170; local_178 = local_178 + 1) {
              bVar5 = Imf_2_5::TiledInputPart::isValidLevel
                                ((TiledInputPart *)
                                 CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                                 in_stack_fffffffffffffadc,in_stack_fffffffffffffad8);
              if (bVar5) {
                local_17c = Imf_2_5::TiledInputPart::levelWidth
                                      ((TiledInputPart *)
                                       CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                       ,in_stack_fffffffffffffadc);
                local_180 = Imf_2_5::TiledInputPart::levelHeight
                                      ((TiledInputPart *)
                                       CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                       ,in_stack_fffffffffffffadc);
                Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x1aa492);
                std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                           (long)local_11c);
                iVar7 = local_180;
                setInputFrameBuffer((FrameBuffer *)in_stack_fffffffffffffbe0,
                                    (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                                    (Array2D<unsigned_int> *)in_stack_fffffffffffffbd0,
                                    (Array2D<float> *)in_stack_fffffffffffffbc8,hData_00,width,
                                    (int)in_stack_fffffffffffffbf0);
                Imf_2_5::TiledInputPart::setFrameBuffer
                          ((TiledInputPart *)
                           CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                           (FrameBuffer *)CONCAT44(in_stack_fffffffffffffadc,iVar7));
                local_1b4 = Imf_2_5::TiledInputPart::numXTiles
                                      ((TiledInputPart *)
                                       CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                       ,in_stack_fffffffffffffadc);
                local_1b8 = Imf_2_5::TiledInputPart::numYTiles
                                      ((TiledInputPart *)
                                       CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                       ,in_stack_fffffffffffffadc);
                in_stack_fffffffffffffad8 = local_178;
                Imf_2_5::TiledInputPart::readTiles
                          ((TiledInputPart *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec,
                           in_stack_fffffffffffffae8,in_stack_fffffffffffffae4,
                           in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,
                           in_stack_fffffffffffffb00);
                pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)
                                     (anonymous_namespace)::pixelTypes,(long)local_11c);
                iVar7 = *pvVar13;
                if (iVar7 == 0) {
                  bVar5 = checkPixels<unsigned_int>
                                    ((Array2D<unsigned_int> *)
                                     CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                                     in_stack_fffffffffffffadc,in_stack_fffffffffffffad8);
                  if (!bVar5) {
                    __assert_fail("checkPixels<unsigned int>(uData, w, h)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                  ,0x350,"void (anonymous namespace)::readWholeFiles(int)");
                  }
                }
                else if (iVar7 == 1) {
                  bVar5 = checkPixels<float>((Array2D<float> *)
                                             CONCAT44(in_stack_fffffffffffffae4,
                                                      in_stack_fffffffffffffae0),
                                             in_stack_fffffffffffffadc,in_stack_fffffffffffffad8);
                  if (!bVar5) {
                    __assert_fail("checkPixels<float>(fData, w, h)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                  ,0x353,"void (anonymous namespace)::readWholeFiles(int)");
                  }
                }
                else if ((iVar7 == 2) &&
                        (bVar5 = checkPixels<half>((Array2D<half> *)
                                                   CONCAT44(in_stack_fffffffffffffae4,
                                                            in_stack_fffffffffffffae0),
                                                   in_stack_fffffffffffffadc,
                                                   in_stack_fffffffffffffad8), !bVar5)) {
                  __assert_fail("checkPixels<half>(hData, w, h)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                ,0x356,"void (anonymous namespace)::readWholeFiles(int)");
                }
                Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1aa6ec);
              }
            }
          }
          break;
        case 2:
          Imf_2_5::DeepScanLineInputPart::DeepScanLineInputPart
                    ((DeepScanLineInputPart *)in_stack_fffffffffffffaf0,
                     (MultiPartInputFile *)
                     CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                     in_stack_fffffffffffffae4);
          Imf_2_5::DeepFrameBuffer::DeepFrameBuffer
                    ((DeepFrameBuffer *)
                     CONCAT17(in_stack_fffffffffffffb07,
                              CONCAT16(in_stack_fffffffffffffb06,
                                       CONCAT15(in_stack_fffffffffffffb05,
                                                CONCAT14(in_stack_fffffffffffffb04,
                                                         in_stack_fffffffffffffb00)))));
          Imf_2_5::Array2D<unsigned_int>::resizeErase
                    ((Array2D<unsigned_int> *)
                     CONCAT17(in_stack_fffffffffffffb07,
                              CONCAT16(in_stack_fffffffffffffb06,
                                       CONCAT15(in_stack_fffffffffffffb05,
                                                CONCAT14(in_stack_fffffffffffffb04,
                                                         in_stack_fffffffffffffb00)))),
                     (long)in_stack_fffffffffffffaf8,(long)in_stack_fffffffffffffaf0);
          puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_c0,0);
          in_stack_fffffffffffffae8 = 0;
          in_stack_fffffffffffffae0 = 0;
          Imf_2_5::Slice::Slice(local_260,UINT,(char *)puVar14,4,0x40,1,1,0.0,false,false);
          Imf_2_5::DeepFrameBuffer::insertSampleCountSlice
                    (in_stack_fffffffffffffaf0,
                     (Slice *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                     (long)local_11c);
          iVar7 = 0x10;
          setInputDeepFrameBuffer
                    (in_stack_fffffffffffffbe0,(int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                     (Array2D<unsigned_int_*> *)in_stack_fffffffffffffbd0,
                     (Array2D<float_*> *)in_stack_fffffffffffffbc8,(Array2D<half_*> *)hData_00,width
                     ,(int)in_stack_fffffffffffffbf0);
          Imf_2_5::DeepScanLineInputPart::setFrameBuffer
                    ((DeepScanLineInputPart *)
                     CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                     (DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffadc,iVar7));
          Imf_2_5::DeepScanLineInputPart::readPixelSampleCounts
                    ((DeepScanLineInputPart *)
                     CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                     in_stack_fffffffffffffadc,iVar7);
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                     (long)local_11c);
          in_stack_fffffffffffffad8 = 0x10;
          allocatePixels(in_stack_fffffffffffffb14,in_stack_fffffffffffffb08,
                         (Array2D<unsigned_int_*> *)
                         CONCAT17(in_stack_fffffffffffffb07,
                                  CONCAT16(in_stack_fffffffffffffb06,
                                           CONCAT15(in_stack_fffffffffffffb05,
                                                    CONCAT14(in_stack_fffffffffffffb04,
                                                             in_stack_fffffffffffffb00)))),
                         (Array2D<float_*> *)in_stack_fffffffffffffaf8,
                         (Array2D<half_*> *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec,
                         in_stack_fffffffffffffb20);
          Imf_2_5::DeepScanLineInputPart::readPixels
                    ((DeepScanLineInputPart *)
                     CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                     in_stack_fffffffffffffadc,in_stack_fffffffffffffad8);
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (anonymous_namespace)::pixelTypes,(long)local_11c);
          iVar7 = *pvVar13;
          if (iVar7 == 0) {
            bVar5 = checkPixels<unsigned_int>
                              ((Array2D<unsigned_int> *)in_stack_fffffffffffffaf0,
                               (Array2D<unsigned_int_*> *)
                               CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                               in_stack_fffffffffffffae4,in_stack_fffffffffffffae0);
            if (!bVar5) {
              __assert_fail("checkPixels<unsigned int>(sampleCount, deepUData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                            ,0x376,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if (iVar7 == 1) {
            bVar5 = checkPixels<float>((Array2D<unsigned_int> *)in_stack_fffffffffffffaf0,
                                       (Array2D<float_*> *)
                                       CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                                       ,in_stack_fffffffffffffae4,in_stack_fffffffffffffae0);
            if (!bVar5) {
              __assert_fail("checkPixels<float>(sampleCount, deepFData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                            ,0x379,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if ((iVar7 == 2) &&
                  (bVar5 = checkPixels<half>((Array2D<unsigned_int> *)in_stack_fffffffffffffaf0,
                                             (Array2D<half_*> *)
                                             CONCAT44(in_stack_fffffffffffffaec,
                                                      in_stack_fffffffffffffae8),
                                             in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                  !bVar5)) {
            __assert_fail("checkPixels<half>(sampleCount, deepHData, width, height)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                          ,0x37c,"void (anonymous namespace)::readWholeFiles(int)");
          }
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                     (long)local_11c);
          releasePixels(CONCAT13(in_stack_fffffffffffffb07,
                                 CONCAT12(in_stack_fffffffffffffb06,
                                          CONCAT11(in_stack_fffffffffffffb05,
                                                   in_stack_fffffffffffffb04))),
                        (Array2D<unsigned_int_*> *)in_stack_fffffffffffffaf8,
                        (Array2D<float_*> *)in_stack_fffffffffffffaf0,
                        (Array2D<half_*> *)
                        CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                        in_stack_fffffffffffffae4,in_stack_fffffffffffffae0);
          Imf_2_5::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x1aaa4d);
          break;
        case 3:
          Imf_2_5::DeepTiledInputPart::DeepTiledInputPart
                    ((DeepTiledInputPart *)in_stack_fffffffffffffaf0,
                     (MultiPartInputFile *)
                     CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                     in_stack_fffffffffffffae4);
          local_26c = Imf_2_5::DeepTiledInputPart::numXLevels((DeepTiledInputPart *)0x1aaa7d);
          local_270 = Imf_2_5::DeepTiledInputPart::numYLevels((DeepTiledInputPart *)0x1aaa9b);
          for (local_274 = 0; local_274 < local_26c; local_274 = local_274 + 1) {
            for (local_278 = 0; local_278 < local_270; local_278 = local_278 + 1) {
              bVar5 = Imf_2_5::DeepTiledInputPart::isValidLevel
                                ((DeepTiledInputPart *)
                                 CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                                 in_stack_fffffffffffffadc,in_stack_fffffffffffffad8);
              if (bVar5) {
                local_27c = Imf_2_5::DeepTiledInputPart::levelWidth
                                      ((DeepTiledInputPart *)
                                       CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                       ,in_stack_fffffffffffffadc);
                local_280 = Imf_2_5::DeepTiledInputPart::levelHeight
                                      ((DeepTiledInputPart *)
                                       CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                       ,in_stack_fffffffffffffadc);
                Imf_2_5::DeepFrameBuffer::DeepFrameBuffer
                          ((DeepFrameBuffer *)
                           CONCAT17(in_stack_fffffffffffffb07,
                                    CONCAT16(in_stack_fffffffffffffb06,
                                             CONCAT15(in_stack_fffffffffffffb05,
                                                      CONCAT14(in_stack_fffffffffffffb04,
                                                               in_stack_fffffffffffffb00)))));
                Imf_2_5::Array2D<unsigned_int>::resizeErase
                          ((Array2D<unsigned_int> *)
                           CONCAT17(in_stack_fffffffffffffb07,
                                    CONCAT16(in_stack_fffffffffffffb06,
                                             CONCAT15(in_stack_fffffffffffffb05,
                                                      CONCAT14(in_stack_fffffffffffffb04,
                                                               in_stack_fffffffffffffb00)))),
                           (long)in_stack_fffffffffffffaf8,(long)in_stack_fffffffffffffaf0);
                t = UINT;
                puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_c0,0);
                in_stack_fffffffffffffae8 = 0;
                in_stack_fffffffffffffae0 = 0;
                Imf_2_5::Slice::Slice
                          (local_320,t,(char *)puVar14,4,(long)local_27c << 2,1,1,0.0,false,false);
                Imf_2_5::DeepFrameBuffer::insertSampleCountSlice
                          (in_stack_fffffffffffffaf0,
                           (Slice *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
                std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                           (long)local_11c);
                iVar7 = local_280;
                setInputDeepFrameBuffer
                          (in_stack_fffffffffffffbe0,(int)((ulong)in_stack_fffffffffffffbd8 >> 0x20)
                           ,(Array2D<unsigned_int_*> *)in_stack_fffffffffffffbd0,
                           (Array2D<float_*> *)in_stack_fffffffffffffbc8,(Array2D<half_*> *)hData_00
                           ,width,(int)in_stack_fffffffffffffbf0);
                Imf_2_5::DeepTiledInputPart::setFrameBuffer
                          ((DeepTiledInputPart *)
                           CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                           (DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffadc,iVar7));
                Imf_2_5::DeepTiledInputPart::numXTiles
                          ((DeepTiledInputPart *)
                           CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                           in_stack_fffffffffffffadc);
                Imf_2_5::DeepTiledInputPart::numYTiles
                          ((DeepTiledInputPart *)
                           CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                           in_stack_fffffffffffffadc);
                Imf_2_5::DeepTiledInputPart::readPixelSampleCounts
                          ((DeepTiledInputPart *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec
                           ,in_stack_fffffffffffffae8,in_stack_fffffffffffffae4,
                           in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,
                           in_stack_fffffffffffffb00);
                std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                           (long)local_11c);
                allocatePixels(in_stack_fffffffffffffb14,in_stack_fffffffffffffb08,
                               (Array2D<unsigned_int_*> *)
                               CONCAT17(in_stack_fffffffffffffb07,
                                        CONCAT16(in_stack_fffffffffffffb06,
                                                 CONCAT15(in_stack_fffffffffffffb05,
                                                          CONCAT14(in_stack_fffffffffffffb04,
                                                                   in_stack_fffffffffffffb00)))),
                               (Array2D<float_*> *)in_stack_fffffffffffffaf8,
                               (Array2D<half_*> *)in_stack_fffffffffffffaf0,
                               in_stack_fffffffffffffaec,in_stack_fffffffffffffb20);
                in_stack_fffffffffffffad8 = local_278;
                Imf_2_5::DeepTiledInputPart::readTiles
                          ((DeepTiledInputPart *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec
                           ,in_stack_fffffffffffffae8,in_stack_fffffffffffffae4,
                           in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,
                           in_stack_fffffffffffffb00);
                pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)
                                     (anonymous_namespace)::pixelTypes,(long)local_11c);
                in_stack_fffffffffffffb20 = *pvVar13;
                if (in_stack_fffffffffffffb20 == 0) {
                  in_stack_fffffffffffffb07 =
                       checkPixels<unsigned_int>
                                 ((Array2D<unsigned_int> *)in_stack_fffffffffffffaf0,
                                  (Array2D<unsigned_int_*> *)
                                  CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                                  in_stack_fffffffffffffae4,in_stack_fffffffffffffae0);
                  if (!(bool)in_stack_fffffffffffffb07) {
                    __assert_fail("checkPixels<unsigned int>(sampleCount, deepUData, w, h)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                  ,0x3ad,"void (anonymous namespace)::readWholeFiles(int)");
                  }
                }
                else if (in_stack_fffffffffffffb20 == 1) {
                  in_stack_fffffffffffffb06 =
                       checkPixels<float>((Array2D<unsigned_int> *)in_stack_fffffffffffffaf0,
                                          (Array2D<float_*> *)
                                          CONCAT44(in_stack_fffffffffffffaec,
                                                   in_stack_fffffffffffffae8),
                                          in_stack_fffffffffffffae4,in_stack_fffffffffffffae0);
                  if (!(bool)in_stack_fffffffffffffb06) {
                    __assert_fail("checkPixels<float>(sampleCount, deepFData, w, h)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                  ,0x3b0,"void (anonymous namespace)::readWholeFiles(int)");
                  }
                }
                else if ((in_stack_fffffffffffffb20 == 2) &&
                        (in_stack_fffffffffffffb05 =
                              checkPixels<half>((Array2D<unsigned_int> *)in_stack_fffffffffffffaf0,
                                                (Array2D<half_*> *)
                                                CONCAT44(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8),
                                                in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                        , !(bool)in_stack_fffffffffffffb05)) {
                  __assert_fail("checkPixels<half>(sampleCount, deepHData, w, h)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                ,0x3b3,"void (anonymous namespace)::readWholeFiles(int)");
                }
                std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                           (long)local_11c);
                releasePixels(CONCAT13(in_stack_fffffffffffffb07,
                                       CONCAT12(in_stack_fffffffffffffb06,
                                                CONCAT11(in_stack_fffffffffffffb05,
                                                         in_stack_fffffffffffffb04))),
                              (Array2D<unsigned_int_*> *)in_stack_fffffffffffffaf8,
                              (Array2D<float_*> *)in_stack_fffffffffffffaf0,
                              (Array2D<half_*> *)
                              CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                              in_stack_fffffffffffffae4,in_stack_fffffffffffffae0);
                Imf_2_5::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x1aafaf);
              }
            }
          }
        }
        in_stack_fffffffffffffaf8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<((ostream *)&std::cerr,"part ");
        in_stack_fffffffffffffaf0 =
             (DeepFrameBuffer *)std::ostream::operator<<(in_stack_fffffffffffffaf8,local_11c);
        std::operator<<((ostream *)in_stack_fffffffffffffaf0," ok ");
        local_128 = local_128 + 1;
      } while( true );
    }
    local_e0 = Imf_2_5::MultiPartInputFile::header
                         ((MultiPartInputFile *)
                          CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                          in_stack_fffffffffffffadc);
    Imf_2_5::Header::displayWindow((Header *)0x1a982a);
    std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
              ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
               (anonymous_namespace)::headers,(long)local_d4);
    Imf_2_5::Header::displayWindow((Header *)0x1a9850);
    bVar5 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                      ((Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffffaf0,
                       (Box<Imath_2_5::Vec2<int>_> *)
                       CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    if (!bVar5) {
      __assert_fail("header.displayWindow() == headers[i].displayWindow()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f0,"void (anonymous namespace)::readWholeFiles(int)");
    }
    Imf_2_5::Header::dataWindow((Header *)0x1a997e);
    std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
              ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
               (anonymous_namespace)::headers,(long)local_d4);
    Imf_2_5::Header::dataWindow((Header *)0x1a99a4);
    bVar5 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                      ((Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffffaf0,
                       (Box<Imath_2_5::Vec2<int>_> *)
                       CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    if (!bVar5) {
      __assert_fail("header.dataWindow() == headers[i].dataWindow()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f1,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pfVar9 = Imf_2_5::Header::pixelAspectRatio((Header *)0x1a9a07);
    fVar1 = *pfVar9;
    std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
              ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
               (anonymous_namespace)::headers,(long)local_d4);
    pfVar9 = Imf_2_5::Header::pixelAspectRatio((Header *)0x1a9a42);
    if ((fVar1 != *pfVar9) || (NAN(fVar1) || NAN(*pfVar9))) {
      __assert_fail("header.pixelAspectRatio() == headers[i].pixelAspectRatio()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f2,"void (anonymous namespace)::readWholeFiles(int)");
    }
    this = Imf_2_5::Header::screenWindowCenter((Header *)0x1a9a92);
    std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
              ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
               (anonymous_namespace)::headers,(long)local_d4);
    v = Imf_2_5::Header::screenWindowCenter((Header *)0x1a9ab8);
    bVar5 = Imath_2_5::Vec2<float>::operator==(this,v);
    if (!bVar5) {
      __assert_fail("header.screenWindowCenter() == headers[i].screenWindowCenter()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f3,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pfVar9 = Imf_2_5::Header::screenWindowWidth((Header *)0x1a9b1b);
    fVar1 = *pfVar9;
    std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
              ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
               (anonymous_namespace)::headers,(long)local_d4);
    pfVar9 = Imf_2_5::Header::screenWindowWidth((Header *)0x1a9b56);
    if ((fVar1 != *pfVar9) || (NAN(fVar1) || NAN(*pfVar9))) break;
    pLVar10 = Imf_2_5::Header::lineOrder((Header *)0x1a9ba6);
    LVar2 = *pLVar10;
    std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
              ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
               (anonymous_namespace)::headers,(long)local_d4);
    pLVar10 = Imf_2_5::Header::lineOrder((Header *)0x1a9bdd);
    if (LVar2 != *pLVar10) {
      __assert_fail("header.lineOrder() == headers[i].lineOrder()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f5,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pCVar11 = Imf_2_5::Header::compression((Header *)0x1a9c28);
    CVar3 = *pCVar11;
    std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
              ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
               (anonymous_namespace)::headers,(long)local_d4);
    pCVar11 = Imf_2_5::Header::compression((Header *)0x1a9c5f);
    if (CVar3 != *pCVar11) {
      __assert_fail("header.compression() == headers[i].compression()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f6,"void (anonymous namespace)::readWholeFiles(int)");
    }
    Imf_2_5::Header::channels((Header *)0x1a9caa);
    std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
              ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
               (anonymous_namespace)::headers,(long)local_d4);
    Imf_2_5::Header::channels((Header *)0x1a9cd0);
    bVar5 = Imf_2_5::ChannelList::operator==
                      ((ChannelList *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                       (ChannelList *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20))
    ;
    if (!bVar5) {
      __assert_fail("header.channels() == headers[i].channels()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f7,"void (anonymous namespace)::readWholeFiles(int)");
    }
    in_stack_fffffffffffffbf0 = Imf_2_5::Header::name_abi_cxx11_((Header *)0x1a9d33);
    std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
              ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
               (anonymous_namespace)::headers,(long)local_d4);
    Imf_2_5::Header::name_abi_cxx11_((Header *)0x1a9d59);
    _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffb07,
                                     CONCAT16(in_stack_fffffffffffffb06,
                                              CONCAT15(in_stack_fffffffffffffb05,
                                                       CONCAT14(in_stack_fffffffffffffb04,
                                                                in_stack_fffffffffffffb00)))),
                            in_stack_fffffffffffffaf8);
    if (!_Var6) {
      __assert_fail("header.name() == headers[i].name()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f8,"void (anonymous namespace)::readWholeFiles(int)");
    }
    if ((local_4 == 1) && (local_d4 == 0)) {
      in_stack_fffffffffffffbe0 =
           (DeepFrameBuffer *)Imf_2_5::Header::type_abi_cxx11_((Header *)0x1a9dc4);
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                 (anonymous_namespace)::headers,(long)local_d4);
      in_stack_fffffffffffffbd8 = Imf_2_5::Header::type_abi_cxx11_((Header *)0x1a9dea);
      bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
      if (!bVar5) {
        __assert_fail("header.type() != headers[i].type()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                      ,0x2fb,"void (anonymous namespace)::readWholeFiles(int)");
      }
    }
    else {
      in_stack_fffffffffffffbd0 = Imf_2_5::Header::type_abi_cxx11_((Header *)0x1a9e3f);
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[]
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                 (anonymous_namespace)::headers,(long)local_d4);
      in_stack_fffffffffffffbc8 = Imf_2_5::Header::type_abi_cxx11_((Header *)0x1a9e65);
      _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffb07,
                                       CONCAT16(in_stack_fffffffffffffb06,
                                                CONCAT15(in_stack_fffffffffffffb05,
                                                         CONCAT14(in_stack_fffffffffffffb04,
                                                                  in_stack_fffffffffffffb00)))),
                              in_stack_fffffffffffffaf8);
      if (!_Var6) {
        __assert_fail("header.type() == headers[i].type()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                      ,0x2fd,"void (anonymous namespace)::readWholeFiles(int)");
      }
    }
    local_d4 = local_d4 + 1;
  }
  __assert_fail("header.screenWindowWidth() == headers[i].screenWindowWidth()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                ,0x2f4,"void (anonymous namespace)::readWholeFiles(int)");
}

Assistant:

void
readWholeFiles (int modification)
{
    Array2D<unsigned int> uData;
    Array2D<float> fData;
    Array2D<half> hData;

    Array2D<unsigned int*> deepUData;
    Array2D<float*> deepFData;
    Array2D<half*> deepHData;

    Array2D<unsigned int> sampleCount;

    MultiPartInputFile file(filename.c_str());
    for (int i = 0; i < file.parts(); i++)
    {
        const Header& header = file.header(i);
        assert (header.displayWindow() == headers[i].displayWindow());
        assert (header.dataWindow() == headers[i].dataWindow());
        assert (header.pixelAspectRatio() == headers[i].pixelAspectRatio());
        assert (header.screenWindowCenter() == headers[i].screenWindowCenter());
        assert (header.screenWindowWidth() == headers[i].screenWindowWidth());
        assert (header.lineOrder() == headers[i].lineOrder());
        assert (header.compression() == headers[i].compression());
        assert (header.channels() == headers[i].channels());
        assert (header.name() == headers[i].name());
        if(modification==1 && i==0)
        {
            assert (header.type() != headers[i].type());
        }else{
            assert (header.type() == headers[i].type());
        }
    }

    cout << "Reading whole files " << flush;

    
    
    //
    // Shuffle part numbers.
    //
    vector<int> shuffledPartNumber;
    for (int i = modification>0 ? 1 : 0; i < static_cast<int>(headers.size()); i++)
        shuffledPartNumber.push_back(i);
    for (size_t i = 0; i < shuffledPartNumber.size(); i++)
    {
        size_t a = random_int(shuffledPartNumber.size());
        size_t b = random_int(shuffledPartNumber.size());
        swap (shuffledPartNumber[a], shuffledPartNumber[b]);
    }


   

    //
    // Start reading whole files.
    //
    int partNumber;
    try
    {
        for (size_t i = 0; i < shuffledPartNumber.size(); i++)
        {
            partNumber = shuffledPartNumber[i];
            switch (partTypes[partNumber])
            {
                case 0:
                {
                    FrameBuffer frameBuffer;
                    setInputFrameBuffer(frameBuffer, pixelTypes[partNumber],
                                        uData, fData, hData, width, height);

                    InputPart part(file, partNumber);
                    part.setFrameBuffer(frameBuffer);
                    part.readPixels(0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert(checkPixels<unsigned int>(uData, width, height));
                            break;
                        case 1:
                            assert(checkPixels<float>(fData, width, height));
                            break;
                        case 2:
                            assert(checkPixels<half>(hData, width, height));
                            break;
                    }
                    break;
                }
                case 1:
                {
                    TiledInputPart part(file, partNumber);
                    int numXLevels = part.numXLevels();
                    int numYLevels = part.numYLevels();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel(xLevel, yLevel))
                                continue;

                            int w = part.levelWidth(xLevel);
                            int h = part.levelHeight(yLevel);

                            FrameBuffer frameBuffer;
                            setInputFrameBuffer(frameBuffer, pixelTypes[partNumber],
                                                uData, fData, hData, w, h);

                            part.setFrameBuffer(frameBuffer);
                            int numXTiles = part.numXTiles(xLevel);
                            int numYTiles = part.numYTiles(yLevel);
                            part.readTiles(0, numXTiles - 1, 0, numYTiles - 1, xLevel, yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert(checkPixels<unsigned int>(uData, w, h));
                                    break;
                                case 1:
                                    assert(checkPixels<float>(fData, w, h));
                                    break;
                                case 2:
                                    assert(checkPixels<half>(hData, w, h));
                                    break;
                            }
                        }
                    break;
                }
                case 2:
                {
                    DeepScanLineInputPart part(file, partNumber);

                    DeepFrameBuffer frameBuffer;

                    sampleCount.resizeErase(height, width);
                    frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,
                                                        (char *) (&sampleCount[0][0]),
                                                        sizeof (unsigned int) * 1,
                                                        sizeof (unsigned int) * width));

                    setInputDeepFrameBuffer(frameBuffer, pixelTypes[partNumber],
                                            deepUData, deepFData, deepHData, width, height);

                    part.setFrameBuffer(frameBuffer);

                    part.readPixelSampleCounts(0, height - 1);

                    allocatePixels(pixelTypes[partNumber], sampleCount,
                                   deepUData, deepFData, deepHData, width, height);

                    part.readPixels(0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert(checkPixels<unsigned int>(sampleCount, deepUData, width, height));
                            break;
                        case 1:
                            assert(checkPixels<float>(sampleCount, deepFData, width, height));
                            break;
                        case 2:
                            assert(checkPixels<half>(sampleCount, deepHData, width, height));
                            break;
                    }

                    releasePixels(pixelTypes[partNumber],
                                  deepUData, deepFData, deepHData, width, height);

                    break;
                }
                case 3:
                {
                    DeepTiledInputPart part(file, partNumber);
                    int numXLevels = part.numXLevels();
                    int numYLevels = part.numYLevels();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel(xLevel, yLevel))
                                continue;

                            int w = part.levelWidth(xLevel);
                            int h = part.levelHeight(yLevel);

                            DeepFrameBuffer frameBuffer;

                            sampleCount.resizeErase(h, w);
                            frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,
                                                                (char *) (&sampleCount[0][0]),
                                                                sizeof (unsigned int) * 1,
                                                                sizeof (unsigned int) * w));

                            setInputDeepFrameBuffer(frameBuffer, pixelTypes[partNumber],
                                                    deepUData, deepFData, deepHData, w, h);

                            part.setFrameBuffer(frameBuffer);

                            int numXTiles = part.numXTiles(xLevel);
                            int numYTiles = part.numYTiles(yLevel);

                            part.readPixelSampleCounts(0, numXTiles - 1, 0, numYTiles - 1,
                                                       xLevel, yLevel);

                            allocatePixels(pixelTypes[partNumber], sampleCount,
                                           deepUData, deepFData, deepHData, w, h);

                            part.readTiles(0, numXTiles - 1, 0, numYTiles - 1, xLevel, yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert(checkPixels<unsigned int>(sampleCount, deepUData, w, h));
                                    break;
                                case 1:
                                    assert(checkPixels<float>(sampleCount, deepFData, w, h));
                                    break;
                                case 2:
                                    assert(checkPixels<half>(sampleCount, deepHData, w, h));
                                    break;
                            }

                            releasePixels(pixelTypes[partNumber],
                                          deepUData, deepFData, deepHData, w, h);
                        }

                    break;
                }
            }
            cerr << "part " << partNumber << " ok ";
            
        }
    }
    catch (...)
    {
        cout << "Error while reading part " << partNumber << endl << flush;
        throw;
    }
}